

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

void sensors_analytics::Sdk::ProfileSetOnceBool(string *property_name,bool bool_value)

{
  Sdk *this;
  Sdk *pSVar1;
  PropertiesNode properties_node;
  string local_c0;
  string local_a0;
  string local_80;
  ObjectNode local_60;
  
  if (instance_ != (Sdk *)0x0) {
    local_60.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    local_60.properties_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._vptr_ObjectNode = (_func_int **)&PTR_SetList_00122d40;
    local_60.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    utils::ObjectNode::SetBool(&local_60,property_name,bool_value);
    this = instance_;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"profile_set_once","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
    pSVar1 = instance_;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
    AddEvent(this,&local_80,&local_a0,&local_60,&pSVar1->distinct_id_,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    local_60._vptr_ObjectNode = (_func_int **)&PTR_SetList_00122d10;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
    ::~_Rb_tree(&local_60.properties_map_._M_t);
  }
  return;
}

Assistant:

void Sdk::ProfileSetOnceBool(const string &property_name, bool bool_value) {
  if (instance_) {
    PropertiesNode properties_node;
    properties_node.SetBool(property_name, bool_value);
    instance_->AddEvent("profile_set_once",
                        "",
                        properties_node,
                        instance_->distinct_id_,
                        "");
  }
}